

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarFindTabByID(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  int local_20;
  int n;
  ImGuiID tab_id_local;
  ImGuiTabBar *tab_bar_local;
  
  if (tab_id != 0) {
    for (local_20 = 0; local_20 < (tab_bar->Tabs).Size; local_20 = local_20 + 1) {
      pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_20);
      if (pIVar1->ID == tab_id) {
        pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_20);
        return pIVar1;
      }
    }
  }
  return (ImGuiTabItem *)0x0;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindTabByID(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (tab_id != 0)
        for (int n = 0; n < tab_bar->Tabs.Size; n++)
            if (tab_bar->Tabs[n].ID == tab_id)
                return &tab_bar->Tabs[n];
    return NULL;
}